

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O0

int bsumPrint(size_t hid,int argc,char **argv)

{
  int iVar1;
  undefined8 *in_RDX;
  int in_ESI;
  size_t in_RDI;
  int ret;
  char str [136];
  octet hash [64];
  char *in_stack_00008f28;
  size_t in_stack_00008f30;
  octet *in_stack_00008f38;
  void *in_stack_fffffffffffffef8;
  char *dest;
  int local_ec;
  char local_e8 [208];
  undefined8 *local_18;
  int local_c;
  size_t local_8;
  
  local_ec = 0;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while (local_c != 0) {
    local_c = local_c + -1;
    iVar1 = bsumHash(in_stack_00008f38,in_stack_00008f30,in_stack_00008f28);
    if (iVar1 == 0) {
      dest = local_e8;
      bsumHidHashLen(local_8);
      hexFrom(dest,in_stack_fffffffffffffef8,0x103af7);
      hexLower(dest);
      printf("%s  %s\n",local_e8,*local_18);
    }
    else {
      local_ec = -1;
    }
    local_18 = local_18 + 1;
  }
  return local_ec;
}

Assistant:

static int bsumPrint(size_t hid, int argc, char* argv[])
{
	octet hash[64];
	char str[64 * 2 + 8];
	int ret = 0;
	for (; argc--; argv++)
	{
		if (bsumHash(hash, hid, argv[0]) != 0)
		{
			ret = -1;
			continue;
		}
		hexFrom(str, hash, bsumHidHashLen(hid));
		hexLower(str);
		printf("%s  %s\n", str, argv[0]);
	}
	return ret;
}